

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O0

bool __thiscall mahjong::Meld::isEdgeWait(Meld *this,Tile last_tile)

{
  bool bVar1;
  const_reference pvVar2;
  bool local_2a;
  IsSame local_20;
  IsTerminal local_1f;
  IsSame local_1e;
  IsTerminal local_1d;
  Tile local_1c;
  Meld *pMStack_18;
  Tile last_tile_local;
  Meld *this_local;
  
  if ((this->is_open & 1U) != 0) {
    return false;
  }
  local_1c = last_tile;
  pMStack_18 = this;
  bVar1 = isTripletOrQuad(this);
  if (!bVar1) {
    pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
    bVar1 = IsTerminal::operator()(&local_1d,pvVar2);
    if (bVar1) {
      pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&this->tiles);
      bVar1 = IsSame::operator()(&local_1e,pvVar2,&local_1c);
      if (bVar1) {
        return true;
      }
    }
    pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&this->tiles);
    bVar1 = IsTerminal::operator()(&local_1f,pvVar2);
    local_2a = false;
    if (bVar1) {
      pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
      local_2a = IsSame::operator()(&local_20,pvVar2,&local_1c);
    }
    return local_2a;
  }
  return false;
}

Assistant:

bool Meld::isEdgeWait(Tile last_tile) const
{
	if (is_open) return false;
	if (isTripletOrQuad()) return false;

	return (IsTerminal()(tiles.front()) && IsSame()(tiles.back(), last_tile)) ||
		(IsTerminal()(tiles.back()) && IsSame()(tiles.front(), last_tile));
}